

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O2

void __thiscall flagser_parameters::~flagser_parameters(flagser_parameters *this)

{
  std::unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>::~unique_ptr
            (&this->filtration_algorithm);
  std::__cxx11::string::~string((string *)&this->hdf5_type);
  std::__cxx11::string::~string((string *)&this->cache);
  std::__cxx11::string::~string((string *)&this->output_format);
  std::__cxx11::string::~string((string *)&this->output_name);
  std::__cxx11::string::~string((string *)&this->input_format);
  return;
}

Assistant:

flagser_parameters() { filtration_algorithm.reset(get_filtration_computer("zero")); }